

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void tinyexr::hufCanonicalCodeTable(longlong *hcode)

{
  long lVar1;
  int i;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long alStack_1d8 [59];
  
  for (lVar2 = 0; lVar2 != 0x3b; lVar2 = lVar2 + 1) {
    alStack_1d8[lVar2] = 0;
  }
  for (lVar2 = 0; lVar2 != 0x10001; lVar2 = lVar2 + 1) {
    alStack_1d8[hcode[lVar2]] = alStack_1d8[hcode[lVar2]] + 1;
  }
  lVar2 = 0;
  for (lVar3 = 0x1d0; lVar3 != 0; lVar3 = lVar3 + -8) {
    lVar1 = *(long *)((long)alStack_1d8 + lVar3);
    *(long *)((long)alStack_1d8 + lVar3) = lVar2;
    lVar2 = lVar1 + lVar2 >> 1;
  }
  for (lVar2 = 0; lVar2 != 0x10001; lVar2 = lVar2 + 1) {
    if (0 < (int)(uint)hcode[lVar2]) {
      uVar4 = (ulong)((uint)hcode[lVar2] & 0x7fffffff);
      lVar3 = alStack_1d8[uVar4];
      alStack_1d8[uVar4] = lVar3 + 1;
      hcode[lVar2] = lVar3 << 6 | uVar4;
    }
  }
  return;
}

Assistant:

static void hufCanonicalCodeTable(long long hcode[HUF_ENCSIZE]) {
  long long n[59];

  //
  // For each i from 0 through 58, count the
  // number of different codes of length i, and
  // store the count in n[i].
  //

  for (int i = 0; i <= 58; ++i) n[i] = 0;

  for (int i = 0; i < HUF_ENCSIZE; ++i) n[hcode[i]] += 1;

  //
  // For each i from 58 through 1, compute the
  // numerically lowest code with length i, and
  // store that code in n[i].
  //

  long long c = 0;

  for (int i = 58; i > 0; --i) {
    long long nc = ((c + n[i]) >> 1);
    n[i] = c;
    c = nc;
  }

  //
  // hcode[i] contains the length, l, of the
  // code for symbol i.  Assign the next available
  // code of length l to the symbol and store both
  // l and the code in hcode[i].
  //

  for (int i = 0; i < HUF_ENCSIZE; ++i) {
    int l = static_cast<int>(hcode[i]);

    if (l > 0) hcode[i] = l | (n[l]++ << 6);
  }
}